

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveImportObj(Parser *parser,int flags)

{
  bool bVar1;
  Token *token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_01;
  undefined4 in_register_00000034;
  Parser *this;
  undefined1 local_a0 [8];
  Identifier ctorName;
  Identifier local_78;
  StringLiteral inputName;
  vector<Expression,_std::allocator<Expression>_> list;
  
  this = (Parser *)CONCAT44(in_register_00000034,flags);
  token = Parser::peekToken(this,0);
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList(this,&list,1,2);
  if (bVar1) {
    inputName._value._M_dataplus._M_p = (pointer)&inputName._value.field_2;
    inputName._value._M_string_length = 0;
    inputName._value.field_2._M_local_buf[0] = '\0';
    bVar1 = Expression::evaluateString
                      (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_start,&inputName,true);
    if (bVar1) {
      if ((long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_start == 0x30) {
        ctorName._name._M_dataplus._M_p = (pointer)&ctorName._name.field_2;
        ctorName._name._M_string_length = 0;
        ctorName._name.field_2._M_local_buf[0] = '\0';
        bVar1 = Expression::evaluateIdentifier
                          (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                           super__Vector_impl_data._M_start + 1,&ctorName);
        if (bVar1) {
          if (Mips.Version == MARCH_PSX) {
            ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                      ((path *)&local_78,(filesystem *)&inputName,source_00);
            std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                      ((path *)local_a0,&local_78);
            ghc::filesystem::path::~path((path *)&local_78);
            if (*(char *)((long)local_a0 + 0x14) == '\0') {
              Parser::printError<>(this,token,"Constructor not supported for non-ELF PSX libraries")
              ;
              std::make_unique<InvalidCommand>();
              (parser->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_78._name._M_dataplus._M_p;
              if (local_a0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_a0 + 8))();
              }
            }
            else {
              (parser->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_a0;
            }
          }
          else {
            ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                      ((path *)&local_78,(filesystem *)&inputName,source_00);
            std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                      ((path *)local_a0,&local_78);
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_a0;
            local_a0 = (undefined1  [8])0x0;
            ghc::filesystem::path::~path((path *)&local_78);
          }
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        std::__cxx11::string::~string((string *)&ctorName);
      }
      else if (Mips.Version == MARCH_PSX) {
        ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                  ((path *)&ctorName,(filesystem *)&inputName,source);
        std::make_unique<DirectivePsxObjImport,ghc::filesystem::path>((path *)&local_78);
        ghc::filesystem::path::~path((path *)&ctorName);
        if (local_78._name._M_dataplus._M_p[0x14] == '\0') {
          ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                    ((path *)&ctorName,(filesystem *)&inputName,source_01);
          std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)local_a0);
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_a0;
          local_a0 = (undefined1  [8])0x0;
          ghc::filesystem::path::~path((path *)&ctorName);
          if ((pointer)local_78._name._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)local_78._name._M_dataplus._M_p + 8))();
          }
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_78._name._M_dataplus._M_p;
        }
      }
      else {
        ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                  ((path *)&ctorName,(filesystem *)&inputName,source);
        std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)&local_78);
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._name._M_dataplus._M_p;
        local_78._name._M_dataplus._M_p = (pointer)0x0;
        ghc::filesystem::path::~path((path *)&ctorName);
      }
    }
    else {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    std::__cxx11::string::~string((string *)&inputName);
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&list);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveImportObj(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		if (Mips.GetVersion() == MARCH_PSX)
		{
			auto attempt = std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
			if (!attempt->isSuccessfullyImported())
			{
				parser.printError(start, "Constructor not supported for non-ELF PSX libraries");
				return std::make_unique<InvalidCommand>();
			}
			else
			{
				return attempt;
			}
		}

		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	if (Mips.GetVersion() == MARCH_PSX)
	{
		// Fallback to ELF, if the PSX library importer fails.
		auto psxLib = std::make_unique<DirectivePsxObjImport>(inputName.path());
		if (!psxLib->isSuccessfullyImported())
			return std::make_unique<DirectiveObjImport>(inputName.path());
		else
			return psxLib;
	}
	else
	{
		return std::make_unique<DirectiveObjImport>(inputName.path());
	}
}